

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_proxy(Curl_easy *data,connectdata *conn,_Bool *async)

{
  resolve_t rVar1;
  timediff_t timeoutms;
  char *pcVar2;
  _Bool *local_50;
  int rc;
  timediff_t timeout_ms;
  hostname *host;
  Curl_dns_entry *hostaddr;
  _Bool *async_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  host = (hostname *)0x0;
  hostaddr = (Curl_dns_entry *)async;
  async_local = (_Bool *)conn;
  conn_local = (connectdata *)data;
  timeoutms = Curl_timeleft(data,(curltime *)0x0,true);
  if ((*(uint *)(async_local + 0x2a0) >> 1 & 1) == 0) {
    local_50 = async_local + 200;
  }
  else {
    local_50 = async_local + 0x90;
  }
  pcVar2 = (*Curl_cstrdup)(*(char **)(local_50 + 0x10));
  *(char **)(async_local + 0x60) = pcVar2;
  if (*(long *)(async_local + 0x60) == 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  rVar1 = Curl_resolv_timeout((Curl_easy *)conn_local,*(char **)(async_local + 0x60),
                              *(int *)(async_local + 0x468),(Curl_dns_entry **)&host,timeoutms);
  *(hostname **)(async_local + 0x30) = host;
  if (rVar1 == CURLRESOLV_PENDING) {
    *(undefined1 *)&hostaddr->addr = 1;
  }
  else {
    if (rVar1 == CURLRESOLV_TIMEDOUT) {
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (host == (hostname *)0x0) {
      Curl_failf((Curl_easy *)conn_local,"Couldn\'t resolve proxy \'%s\'",
                 *(undefined8 *)(local_50 + 0x18));
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode resolve_proxy(struct Curl_easy *data,
                              struct connectdata *conn,
                              bool *async)
{
  struct Curl_dns_entry *hostaddr = NULL;
  struct hostname *host;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
  int rc;

  DEBUGASSERT(conn->dns_entry == NULL);

  host = conn->bits.socksproxy ? &conn->socks_proxy.host :
    &conn->http_proxy.host;

  conn->hostname_resolve = strdup(host->name);
  if(!conn->hostname_resolve)
    return CURLE_OUT_OF_MEMORY;

  rc = Curl_resolv_timeout(data, conn->hostname_resolve, (int)conn->port,
                           &hostaddr, timeout_ms);
  conn->dns_entry = hostaddr;
  if(rc == CURLRESOLV_PENDING)
    *async = TRUE;
  else if(rc == CURLRESOLV_TIMEDOUT)
    return CURLE_OPERATION_TIMEDOUT;
  else if(!hostaddr) {
    failf(data, "Couldn't resolve proxy '%s'", host->dispname);
    return CURLE_COULDNT_RESOLVE_PROXY;
  }

  return CURLE_OK;
}